

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxFastRT<double>::minDelta(SPxFastRT<double> *this,int *nr,double *max,double *maxabs)

{
  SPxSolverBase<double> *pSVar1;
  int i;
  int i_00;
  DataKey DVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffff00000000;
  this->iscoid = true;
  pSVar1 = (this->super_SPxRatioTester<double>).thesolver;
  i = minDelta(this,max,maxabs,pSVar1->theCoPvec,pSVar1->theCoLbound,pSVar1->theCoUbound,0,1);
  this->iscoid = false;
  pSVar1 = (this->super_SPxRatioTester<double>).thesolver;
  i_00 = minDelta(this,max,maxabs,pSVar1->thePvec,pSVar1->theLbound,pSVar1->theUbound,0,1);
  if (i_00 < 0) {
    if (i < 0) {
      *nr = -1;
      DVar2.info = 0;
      DVar2.idx = 0;
      goto LAB_00239ea2;
    }
    *nr = i;
    DVar2 = (DataKey)SPxSolverBase<double>::coId((this->super_SPxRatioTester<double>).thesolver,i);
  }
  else {
    *nr = i_00;
    DVar2 = (DataKey)SPxSolverBase<double>::id((this->super_SPxRatioTester<double>).thesolver,i_00);
  }
  uVar3 = (ulong)DVar2 & 0xffffffff00000000;
LAB_00239ea2:
  return (SPxId)((ulong)DVar2 & 0xffffffff | uVar3);
}

Assistant:

SPxId SPxFastRT<R>::minDelta(
   int& nr,
   R& max,
   R& maxabs)
{
   /* The following cause side effects on coPvec and pVec - both changes may be needed later in
      minSelect(). We can therefore not move the first function after the (indp >= 0) check. */
   iscoid = true;
   const int indc = minDelta(max, maxabs,
                             this->thesolver->coPvec(), this->thesolver->lcBound(), this->thesolver->ucBound(), 0, 1);
   iscoid = false;
   const int indp = minDelta(max, maxabs,
                             this->thesolver->pVec(), this->thesolver->lpBound(), this->thesolver->upBound(), 0, 1);

   if(indp >= 0)
   {
      nr = indp;
      return this->thesolver->id(indp);
   }

   if(indc >= 0)
   {
      nr = indc;
      return this->thesolver->coId(indc);
   }

   nr = -1;
   return SPxId();
}